

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainWindow.cpp
# Opt level: O3

void __thiscall
MainWindow::handleFocusChange(MainWindow *this,QWidget *oldWidget,QWidget *newWidget)

{
  bool bVar1;
  long lVar2;
  PianoWidget *pPVar3;
  IMidiReceiver *receiver;
  InstrumentEditor *this_00;
  
  bVar1 = Midi::isOpen(&this->mMidi);
  if ((!bVar1) || (lVar2 = QApplication::activeModalWidget(), lVar2 != 0)) {
    return;
  }
  receiver = &this->mPatternEditor->super_IMidiReceiver;
  if (this->mPatternEditor == (PatternEditor *)0x0) {
    receiver = (IMidiReceiver *)0x0;
  }
  if (newWidget != (QWidget *)0x0) {
    do {
      this_00 = (InstrumentEditor *)this->mWaveEditor;
      if (((InstrumentEditor *)newWidget == (InstrumentEditor *)this->mWaveEditor) ||
         (this_00 = this->mInstrumentEditor,
         (InstrumentEditor *)newWidget == this->mInstrumentEditor)) {
        pPVar3 = BaseEditor::piano(&this_00->super_BaseEditor);
        receiver = &pPVar3->super_IMidiReceiver;
        if (pPVar3 == (PianoWidget *)0x0) {
          receiver = (IMidiReceiver *)0x0;
        }
        break;
      }
      newWidget = *(QWidget **)
                   (*(long *)&(((InstrumentEditor *)newWidget)->super_BaseEditor).
                              super_PersistantDialog.field_0x8 + 0x10);
    } while ((InstrumentEditor *)newWidget != (InstrumentEditor *)0x0);
  }
  Midi::setReceiver(&this->mMidi,receiver);
  return;
}

Assistant:

void MainWindow::handleFocusChange(QWidget *oldWidget, QWidget *newWidget) {
    Q_UNUSED(oldWidget)

    // this handler is for determining where MIDI events will go, based on
    // who has focus. If MIDI is disabled we don't need to do anything

    // performance notes
    // searching is required by walking the newWidget's parents until either
    // nullptr or the editor dock widgets are found. Performance depends on
    // how deep newWidget is nested in the hierarchy.

    // alternative solution:
    // BaseEditor could have an eventFilter installed on all of its child widgets,
    // that check for FocusIn and FocusOut events, which we could emit a
    // signal for these and the MainWindow would handle them appropriately.

    if (mMidi.isOpen()) {
        if (QApplication::activeModalWidget()) {
            return; // ignore if a dialog is open
        }

        // MIDI events by default go to the pattern editor
        IMidiReceiver *receiver = mPatternEditor;

        QWidget *widget = newWidget;
        while (widget) {
            // search if this widget's parent is the instrument or waveform editor dock
            // if it is, midi events will go to the editor's piano widget
            if (widget == mWaveEditor) {
                receiver = mWaveEditor->piano();
                break;
            } else if (widget == mInstrumentEditor) {
                receiver = mInstrumentEditor->piano();
                break;
            }
            widget = widget->parentWidget();
        }
        mMidi.setReceiver(receiver);
    }

}